

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-vfp.inc.c
# Opt level: O0

void disas_vfp_extract_disas_vfp_Fmt_22(DisasContext_conflict1 *ctx,arg_disas_vfp9 *a,uint32_t insn)

{
  uint32_t uVar1;
  uint32_t fieldval;
  uint32_t insn_local;
  arg_disas_vfp9 *a_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar1 = extract32(insn,0x14,1);
  a->l = uVar1;
  uVar1 = extract32(insn,0x10,4);
  a->rn = uVar1;
  uVar1 = extract32(insn,0,8);
  a->imm = uVar1;
  uVar1 = extract32(insn,0xc,4);
  fieldval = extract32(insn,0x16,1);
  uVar1 = deposit32(uVar1,4,0x1c,fieldval);
  a->vd = uVar1;
  a->p = 1;
  a->u = 0;
  a->w = 1;
  return;
}

Assistant:

static void disas_vfp_extract_disas_vfp_Fmt_22(DisasContext *ctx, arg_disas_vfp9 *a, uint32_t insn)
{
    a->l = extract32(insn, 20, 1);
    a->rn = extract32(insn, 16, 4);
    a->imm = extract32(insn, 0, 8);
    a->vd = deposit32(extract32(insn, 12, 4), 4, 28, extract32(insn, 22, 1));
    a->p = 1;
    a->u = 0;
    a->w = 1;
}